

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

void * ecs_os_memdup(void *src,ecs_size_t size)

{
  void *pvVar1;
  
  if (src == (void *)0x0) {
    return (void *)0x0;
  }
  pvVar1 = (*ecs_os_api.malloc_)(size);
  _ecs_assert(pvVar1 != (void *)0x0,0x11,(char *)0x0,"dst != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/misc.c"
              ,0x6c);
  if (pvVar1 != (void *)0x0) {
    pvVar1 = memcpy(pvVar1,src,(long)size);
    return pvVar1;
  }
  __assert_fail("dst != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/misc.c"
                ,0x6c,"void *ecs_os_memdup(const void *, ecs_size_t)");
}

Assistant:

void* ecs_os_memdup(
    const void *src, 
    ecs_size_t size) 
{
    if (!src) {
        return NULL;
    }
    
    void *dst = ecs_os_malloc(size);
    ecs_assert(dst != NULL, ECS_OUT_OF_MEMORY, NULL);
    ecs_os_memcpy(dst, src, size);  
    return dst;  
}